

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

void CaDiCaL::Options::usage(void)

{
  char *pcVar1;
  
  printf("  %-26s allocate clauses in arena [%s]\n","--arena=bool","true");
  printf("  %-26s keep clauses compact [%s]\n","--arenacompact=bool","true");
  printf("  %-26s sort clauses in arena [%s]\n","--arenasort=bool","true");
  printf("  %-26s 1=clause, 2=var, 3=queue [3]\n","--arenatype=1..3");
  printf("  %-26s use binary proof format [%s]\n","--binary=bool","true");
  printf("  %-26s blocked clause elimination [%s]\n","--block=bool","false");
  printf("  %-26s maximum clause size [1e5]\n","--blockmaxclslim=1..2e9");
  printf("  %-26s minimum clause size [2]\n","--blockminclslim=2..2e9");
  printf("  %-26s occurrence limit [1e2]\n","--blockocclim=1..2e9");
  printf("  %-26s bump variables [%s]\n","--bump=bool","true");
  printf("  %-26s bump reason literals too [%s]\n","--bumpreason=bool","true");
  printf("  %-26s bump reason depth [1]\n","--bumpreasondepth=1..3");
  printf("  %-26s enable internal checking [%s]\n","--check=bool","false");
  printf("  %-26s check assumptions satisfied [%s]\n","--checkassumptions=bool","true");
  printf("  %-26s check constraint satisfied [%s]\n","--checkconstraint=bool","true");
  printf("  %-26s check failed literals form core [%s]\n","--checkfailed=bool","true");
  printf("  %-26s check all frozen semantics [%s]\n","--checkfrozen=bool","false");
  printf("  %-26s 1=drat, 2=lrat, 3=both [3]\n","--checkproof=0..3");
  printf("  %-26s check witness internally [%s]\n","--checkwitness=bool","true");
  printf("  %-26s chronological backtracking [1]\n","--chrono=0..2");
  printf("  %-26s force always chronological [%s]\n","--chronoalways=bool","false");
  printf("  %-26s chronological level limit [1e2]\n","--chronolevelim=0..2e9");
  printf("  %-26s reuse trail chronologically [%s]\n","--chronoreusetrail=bool","true");
  printf("  %-26s compact internal variables [%s]\n","--compact=bool","true");
  printf("  %-26s compacting interval [2e3]\n","--compactint=1..2e9");
  printf("  %-26s inactive limit per mille [1e2]\n","--compactlim=0..1e3");
  printf("  %-26s minimum inactive limit [1e2]\n","--compactmin=1..2e9");
  printf("  %-26s globally blocked clause elim [%s]\n","--condition=bool","false");
  printf("  %-26s initial conflict interval [1e4]\n","--conditionint=1..2e9");
  printf("  %-26s maximum condition efficiency [1e7]\n","--conditionmaxeff=0..2e9");
  printf("  %-26s maximum clause variable ratio [100]\n","--conditionmaxrat=1..2e9");
  printf("  %-26s minimum condition efficiency [1e6]\n","--conditionmineff=0..2e9");
  printf("  %-26s relative efficiency per mille [100]\n","--conditionreleff=1..1e5");
  printf("  %-26s covered clause elimination [%s]\n","--cover=bool","false");
  printf("  %-26s maximum clause size [1e5]\n","--covermaxclslim=1..2e9");
  printf("  %-26s maximum cover efficiency [1e8]\n","--covermaxeff=0..2e9");
  printf("  %-26s minimum clause size [2]\n","--coverminclslim=2..2e9");
  printf("  %-26s minimum cover efficiency [1e6]\n","--covermineff=0..2e9");
  printf("  %-26s relative efficiency per mille [4]\n","--coverreleff=1..1e5");
  printf("  %-26s decompose BIG in SCCs and ELS [%s]\n","--decompose=bool","true");
  printf("  %-26s number of decompose rounds [2]\n","--decomposerounds=1..16");
  printf("  %-26s remove duplicated binaries [%s]\n","--deduplicate=bool","true");
  printf("  %-26s subsume recently learned [%s]\n","--eagersubsume=bool","true");
  printf("  %-26s limit on subsumed candidates [20]\n","--eagersubsumelim=1..1e3");
  printf("  %-26s bounded variable elimination [%s]\n","--elim=bool","true");
  printf("  %-26s find AND gates [%s]\n","--elimands=bool","true");
  printf("  %-26s maximum elimination efficiency [2e9]\n","--elimaxeff=0..2e9");
  printf("  %-26s eager backward subsumption [%s]\n","--elimbackward=bool","true");
  printf("  %-26s maximum elimination bound [16]\n","--elimboundmax=-1..2e6");
  printf("  %-26s minimum elimination bound [0]\n","--elimboundmin=-1..2e6");
  printf("  %-26s resolvent size limit [1e2]\n","--elimclslim=2..2e9");
  printf("  %-26s find equivalence gates [%s]\n","--elimequivs=bool","true");
  printf("  %-26s minimum elimination efficiency [1e7]\n","--elimineff=0..2e9");
  printf("  %-26s elimination interval [2e3]\n","--elimint=1..2e9");
  printf("  %-26s find if-then-else gates [%s]\n","--elimites=bool","true");
  printf("  %-26s limit resolutions [%s]\n","--elimlimited=bool","true");
  printf("  %-26s occurrence limit [1e2]\n","--elimocclim=0..2e9");
  printf("  %-26s elim score product weight [1]\n","--elimprod=0..1e4");
  printf("  %-26s relative efficiency per mille [1e3]\n","--elimreleff=1..1e5");
  printf("  %-26s usual number of rounds [2]\n","--elimrounds=1..512");
  printf("  %-26s elimination by substitution [%s]\n","--elimsubst=bool","true");
  printf("  %-26s elimination score sum weight [1]\n","--elimsum=0..1e4");
  printf("  %-26s maximum XOR size [5]\n","--elimxorlim=2..27");
  printf("  %-26s find XOR gates [%s]\n","--elimxors=bool","true");
  printf("  %-26s window fast glue [33]\n","--emagluefast=1..2e9");
  printf("  %-26s window slow glue [1e5]\n","--emaglueslow=1..2e9");
  printf("  %-26s window back-jump level [1e5]\n","--emajump=1..2e9");
  printf("  %-26s window back-track level [1e5]\n","--emalevel=1..2e9");
  printf("  %-26s window learned clause size [1e5]\n","--emasize=1..2e9");
  printf("  %-26s window fast trail [1e2]\n","--ematrailfast=1..2e9");
  printf("  %-26s window slow trail [1e5]\n","--ematrailslow=1..2e9");
  printf("  %-26s eagerly ask for all reasons (0: only when needed) [%s]\n","--exteagerreasons=bool"
         ,"true");
  printf("  %-26s after eagerly asking for reasons recalculate all levels (0: trust the external tool) [%s]\n"
         ,"--exteagerrecalc=bool","true");
  printf("  %-26s external lrat [%s]\n","--externallrat=bool","false");
  printf("  %-26s flush redundant clauses [%s]\n","--flush=bool","false");
  printf("  %-26s interval increase [3]\n","--flushfactor=1..1e3");
  printf("  %-26s initial limit [1e5]\n","--flushint=1..2e9");
  printf("  %-26s always use initial phase [%s]\n","--forcephase=bool","false");
  printf("  %-26s 1=frat(lrat), 2=frat(drat) [0]\n","--frat=0..2");
  printf("  %-26s incremental proof format [%s]\n","--idrup=bool","false");
  printf("  %-26s ILB (incremental lazy backtrack) [%s]\n","--ilb=bool","false");
  printf("  %-26s trail reuse for assumptions (ILB-like) [%s]\n","--ilbassumptions=bool","false");
  printf("  %-26s enable inprocessing [%s]\n","--inprocessing=bool","true");
  printf("  %-26s variable instantiation [%s]\n","--instantiate=bool","false");
  printf("  %-26s minimum clause size [3]\n","--instantiateclslim=2..2e9");
  printf("  %-26s maximum occurrence limit [1]\n","--instantiateocclim=1..2e9");
  printf("  %-26s instantiate each clause once [%s]\n","--instantiateonce=bool","true");
  printf("  %-26s linear incremental proof format [%s]\n","--lidrup=bool","false");
  printf("  %-26s use LRAT proof format [%s]\n","--lrat=bool","false");
  printf("  %-26s search for lucky phases [%s]\n","--lucky=bool","true");
  printf("  %-26s minimize learned clauses [%s]\n","--minimize=bool","true");
  printf("  %-26s minimization depth [1e3]\n","--minimizedepth=0..1e3");
  printf("  %-26s on-the-fly self subsumption [%s]\n","--otfs=bool","true");
  printf("  %-26s initial phase [%s]\n","--phase=bool","true");
  printf("  %-26s failed literal probing [%s]\n","--probe=bool","true");
  printf("  %-26s learn hyper binary clauses [%s]\n","--probehbr=bool","true");
  printf("  %-26s probing interval [5e3]\n","--probeint=1..2e9");
  printf("  %-26s maximum probing efficiency [1e8]\n","--probemaxeff=0..2e9");
  printf("  %-26s minimum probing efficiency [1e6]\n","--probemineff=0..2e9");
  printf("  %-26s relative efficiency per mille [20]\n","--probereleff=1..1e5");
  printf("  %-26s probing rounds [1]\n","--proberounds=1..16");
  printf("  %-26s profiling level [2]\n","--profile=0..4");
  printf("  %-26s disable all messages [%s]\n","--quiet=bool","false");
  printf("  %-26s radix sort limit [32]\n","--radixsortlim=0..2e9");
  printf("  %-26s real instead of process time [%s]\n","--realtime=bool","false");
  printf("  %-26s reduce useless clauses [%s]\n","--reduce=bool","true");
  printf("  %-26s reduce interval [300]\n","--reduceint=10..1e6");
  printf("  %-26s reduce fraction in percent [75]\n","--reducetarget=10..1e2");
  printf("  %-26s glue of kept learned clauses [2]\n","--reducetier1glue=1..2e9");
  printf("  %-26s glue of tier two clauses [6]\n","--reducetier2glue=1..2e9");
  printf("  %-26s reluctant doubling period [1024]\n","--reluctant=0..2e9");
  printf("  %-26s reluctant doubling period [1048576]\n","--reluctantmax=0..2e9");
  printf("  %-26s enable resetting phase [%s]\n","--rephase=bool","true");
  printf("  %-26s rephase interval [1e3]\n","--rephaseint=1..2e9");
  pcVar1 = "true";
  if (reportdefault == 0) {
    pcVar1 = "false";
  }
  printf("  %-26s enable reporting [%s]\n","--report=bool",pcVar1);
  printf("  %-26s report even if not successful [%s]\n","--reportall=bool","false");
  printf("  %-26s use solving not process time [%s]\n","--reportsolve=bool","false");
  printf("  %-26s enable restarts [%s]\n","--restart=bool","true");
  printf("  %-26s restart interval [2]\n","--restartint=1..2e9");
  printf("  %-26s slow fast margin in percent [10]\n","--restartmargin=0..1e2");
  printf("  %-26s enable trail reuse [%s]\n","--restartreusetrail=bool","true");
  printf("  %-26s restore all clauses (2=really) [0]\n","--restoreall=0..2");
  printf("  %-26s remove satisfied clauses [%s]\n","--restoreflush=bool","false");
  printf("  %-26s reverse variable ordering [%s]\n","--reverse=bool","false");
  printf("  %-26s use EVSIDS scores [%s]\n","--score=bool","true");
  printf("  %-26s score factor per mille [950]\n","--scorefactor=500..1e3");
  printf("  %-26s random seed [0]\n","--seed=0..2e9");
  printf("  %-26s shrink conflict clause (1=only with binary, 2=minimize when pulling, 3=full) [3]\n"
         ,"--shrink=0..3");
  printf("  %-26s use a reap for shrinking [%s]\n","--shrinkreap=bool","true");
  printf("  %-26s shuffle variables [%s]\n","--shuffle=bool","false");
  printf("  %-26s shuffle variable queue [%s]\n","--shufflequeue=bool","true");
  printf("  %-26s not reverse but random [%s]\n","--shufflerandom=bool","false");
  printf("  %-26s shuffle variable scores [%s]\n","--shufflescores=bool","true");
  printf("  %-26s enable stabilizing phases [%s]\n","--stabilize=bool","true");
  printf("  %-26s phase increase in percent [200]\n","--stabilizefactor=101..2e9");
  printf("  %-26s stabilizing interval [1e3]\n","--stabilizeint=1..2e9");
  printf("  %-26s maximum stabilizing phase [2e9]\n","--stabilizemaxint=1..2e9");
  printf("  %-26s only stabilizing phases [%s]\n","--stabilizeonly=bool","false");
  printf("  %-26s print all statistics at the end of the run [%s]\n","--stats=bool","false");
  printf("  %-26s enable clause subsumption [%s]\n","--subsume=bool","true");
  printf("  %-26s watch list length limit [1e4]\n","--subsumebinlim=0..2e9");
  printf("  %-26s clause length limit [1e2]\n","--subsumeclslim=0..2e9");
  printf("  %-26s subsume interval [1e4]\n","--subsumeint=1..2e9");
  printf("  %-26s limit subsumption checks [%s]\n","--subsumelimited=bool","true");
  printf("  %-26s maximum subsuming efficiency [1e8]\n","--subsumemaxeff=0..2e9");
  printf("  %-26s minimum subsuming efficiency [1e6]\n","--subsumemineff=0..2e9");
  printf("  %-26s watch list length limit [1e2]\n","--subsumeocclim=0..2e9");
  printf("  %-26s relative efficiency per mille [1e3]\n","--subsumereleff=1..1e5");
  printf("  %-26s strengthen during subsume [%s]\n","--subsumestr=bool","true");
  printf("  %-26s target phases (1=stable only) [1]\n","--target=0..2");
  printf("  %-26s termination check interval [10]\n","--terminateint=0..1e4");
  printf("  %-26s hyper ternary resolution [%s]\n","--ternary=bool","true");
  printf("  %-26s max clauses added in percent [1e3]\n","--ternarymaxadd=0..1e4");
  printf("  %-26s ternary maximum efficiency [1e8]\n","--ternarymaxeff=0..2e9");
  printf("  %-26s minimum ternary efficiency [1e6]\n","--ternarymineff=1..2e9");
  printf("  %-26s ternary occurrence limit [1e2]\n","--ternaryocclim=1..2e9");
  printf("  %-26s relative efficiency per mille [10]\n","--ternaryreleff=1..1e5");
  printf("  %-26s maximum ternary rounds [2]\n","--ternaryrounds=1..16");
  printf("  %-26s transitive reduction of BIG [%s]\n","--transred=bool","true");
  printf("  %-26s maximum efficiency [1e8]\n","--transredmaxeff=0..2e9");
  printf("  %-26s minimum efficiency [1e6]\n","--transredmineff=0..2e9");
  printf("  %-26s relative efficiency per mille [1e2]\n","--transredreleff=1..1e5");
  printf("  %-26s more verbose messages [0]\n","--verbose=0..3");
  printf("  %-26s odd=checkdeletions, > 2=drat [0]\n","--veripb=0..4");
  printf("  %-26s vivification [%s]\n","--vivify=bool","true");
  printf("  %-26s instantiate last literal when vivify [%s]\n","--vivifyinst=bool","true");
  printf("  %-26s maximum efficiency [2e7]\n","--vivifymaxeff=0..2e9");
  printf("  %-26s minimum efficiency [2e4]\n","--vivifymineff=0..2e9");
  printf("  %-26s vivify once: 1=red, 2=red+irr [0]\n","--vivifyonce=0..2");
  printf("  %-26s redundant efficiency per mille [75]\n","--vivifyredeff=0..1e3");
  printf("  %-26s relative efficiency per mille [20]\n","--vivifyreleff=1..1e5");
  printf("  %-26s enable random walks [%s]\n","--walk=bool","true");
  printf("  %-26s maximum efficiency [1e7]\n","--walkmaxeff=0..2e9");
  printf("  %-26s minimum efficiency [1e5]\n","--walkmineff=0..1e7");
  printf("  %-26s walk in non-stabilizing phase [%s]\n","--walknonstable=bool","true");
  printf("  %-26s walk redundant clauses too [%s]\n","--walkredundant=bool","false");
  printf("  %-26s relative efficiency per mille [20]\n","--walkreleff=1..1e5");
  return;
}

Assistant:

void Options::usage () {
  // We prefer the macro iteration here since '[VLH]' might be '1e9' etc.
#define OPTION(N, V, L, H, O, P, R, D) \
  if ((L) == 0 && (H) == 1) \
    printf ("  %-26s " D " [%s]\n", "--" #N "=bool", \
            (bool) (V) ? "true" : "false"); \
  else \
    printf ("  %-26s " D " [" #V "]\n", "--" #N "=" #L ".." #H);
  OPTIONS
#undef OPTION
}